

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O0

int Min_SopCheck(Min_Man_t *p)

{
  int iVar1;
  Min_Cube_t *p_00;
  int local_2c;
  Min_Cube_t *pMStack_28;
  int i;
  Min_Cube_t *pThis;
  Min_Cube_t *pCube;
  Min_Man_t *p_local;
  
  p_00 = Min_CubeAlloc(p);
  Min_CubeXorBit(p_00,1);
  Min_CubeXorBit(p_00,3);
  Min_CubeXorBit(p_00,4);
  Min_CubeXorBit(p_00,6);
  Min_CubeXorBit(p_00,8);
  Min_CubeXorBit(p_00,0xb);
  Min_CubeXorBit(p_00,0xd);
  *(uint *)&p_00->field_0x8 = *(uint *)&p_00->field_0x8 & 0x3fffff | 0x1c00000;
  local_2c = 0;
  do {
    if (p->nVars < local_2c) {
      Min_CubeRecycle(p,p_00);
      return 0;
    }
    for (pMStack_28 = p->ppStore[local_2c]; pMStack_28 != (Min_Cube_t *)0x0;
        pMStack_28 = pMStack_28->pNext) {
      if ((pMStack_28 != p->pBubble) && (iVar1 = Min_CubeIsContained(pMStack_28,p_00), iVar1 != 0))
      {
        Min_CubeRecycle(p,p_00);
        return 1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Min_SopCheck( Min_Man_t * p )
{
    Min_Cube_t * pCube, * pThis;
    int i;

    pCube = Min_CubeAlloc( p );
    Min_CubeXorBit( pCube, 2*0+1 );
    Min_CubeXorBit( pCube, 2*1+1 );
    Min_CubeXorBit( pCube, 2*2+0 );
    Min_CubeXorBit( pCube, 2*3+0 );
    Min_CubeXorBit( pCube, 2*4+0 );
    Min_CubeXorBit( pCube, 2*5+1 );
    Min_CubeXorBit( pCube, 2*6+1 );
    pCube->nLits = 7;

//    Min_CubeWrite( stdout, pCube );

    // check that the cubes contain it
    for ( i = 0; i <= p->nVars; i++ )
        Min_CoverForEachCube( p->ppStore[i], pThis )
            if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
            {
                Min_CubeRecycle( p, pCube );
                return 1;
            }
    Min_CubeRecycle( p, pCube );
    return 0;
}